

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O2

void __thiscall gvr::Model::translate(Model *this,Vector3d *v)

{
  SVector<double,_3> SStack_38;
  
  gmath::SVector<double,_3>::operator+=(&this->origin,v);
  gmath::SVector<double,_3>::operator+(&SStack_38,&this->Tc,v);
  setDefCameraRT(this,&this->Rc,&SStack_38);
  return;
}

Assistant:

virtual void translate(const gmath::Vector3d &v)
    {
      origin+=v;
      setDefCameraRT(getDefCameraR(), getDefCameraT()+v);
    }